

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isValidForDPIArg(Type *this)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  Type *pTVar5;
  long lVar6;
  
  while( true ) {
    pTVar4 = getCanonicalType(this);
    pTVar5 = getCanonicalType(pTVar4);
    bVar2 = IntegralType::isKind((pTVar5->super_Symbol).kind);
    if (bVar2) {
      return true;
    }
    pTVar5 = getCanonicalType(pTVar4);
    if ((pTVar5->super_Symbol).kind == FloatingType) {
      return true;
    }
    pTVar5 = getCanonicalType(pTVar4);
    if ((pTVar5->super_Symbol).kind == StringType) {
      return true;
    }
    pTVar5 = getCanonicalType(pTVar4);
    if ((pTVar5->super_Symbol).kind == CHandleType) break;
    pTVar5 = getCanonicalType(pTVar4);
    if ((pTVar5->super_Symbol).kind == VoidType) {
      return true;
    }
    if (((pTVar4->super_Symbol).kind | Definition) != DPIOpenArrayType) {
      pTVar5 = getCanonicalType(pTVar4);
      if ((pTVar5->super_Symbol).kind != UnpackedStructType) {
        return false;
      }
      pTVar5 = pTVar4[1].canonical;
      bVar2 = pTVar5 == (Type *)0x0;
      if (bVar2) {
        return bVar2;
      }
      pSVar1 = pTVar4[1].super_Symbol.originatingSyntax;
      pTVar4 = DeclaredType::getType((DeclaredType *)(*(long *)pSVar1 + 0x40));
      bVar3 = isValidForDPIArg(pTVar4);
      if (!bVar3) {
        return bVar2;
      }
      lVar6 = 8;
      do {
        bVar2 = (long)pTVar5 << 3 == lVar6;
        if (bVar2) {
          return bVar2;
        }
        pTVar4 = DeclaredType::getType
                           ((DeclaredType *)(*(long *)((long)&pSVar1->kind + lVar6) + 0x40));
        bVar3 = isValidForDPIArg(pTVar4);
        lVar6 = lVar6 + 8;
      } while (bVar3);
      return bVar2;
    }
    this = getArrayElementType(pTVar4);
  }
  return true;
}

Assistant:

bool Type::isValidForDPIArg() const {
    auto& ct = getCanonicalType();
    if (ct.isIntegral() || ct.isFloating() || ct.isString() || ct.isCHandle() || ct.isVoid())
        return true;

    if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType ||
        ct.kind == SymbolKind::DPIOpenArrayType) {
        return ct.getArrayElementType()->isValidForDPIArg();
    }

    if (ct.isUnpackedStruct()) {
        for (auto field : ct.as<UnpackedStructType>().fields) {
            if (!field->getType().isValidForDPIArg())
                return false;
        }
        return true;
    }

    return false;
}